

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_Brep::IsValidTrim(ON_Brep *this,int trim_index,ON_TextLog *text_log)

{
  ON_3dPoint *pOVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ON_Curve *pOVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ON_BrepTrim *this_00;
  ON_Curve **ppOVar12;
  ON_Curve *pOVar13;
  double *pdVar14;
  ON_BrepEdge *pOVar15;
  int *piVar16;
  ON_BrepTrim *pOVar17;
  uint *puVar18;
  ON_BrepLoop *pOVar19;
  ON_BrepLoop *loop_4;
  ON_BrepLoop *loop_3;
  ON_BrepTrim *other_trim_1;
  uint local_c0;
  int i_1;
  int eti;
  int other_ti_1;
  ON_BrepEdge *edge_3;
  ON_BrepLoop *loop_2;
  ON_BrepEdge *edge_2;
  ON_BrepLoop *loop_1;
  ON_BrepEdge *edge_1;
  ON_BrepLoop *loop;
  ON_BrepTrim *other_trim;
  int other_ti;
  int i;
  ON_BrepEdge *edge;
  int trim_eti;
  int ei;
  int vi1;
  int vi0;
  ON_Interval c2_domain;
  ON_Interval trim_domain;
  int c2_dim;
  ON_Curve *pC;
  ON_BrepTrim *trim;
  ON_TextLog *text_log_local;
  int trim_index_local;
  ON_Brep *this_local;
  
  if ((trim_index < 0) ||
     (iVar7 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T),
     iVar7 <= trim_index)) {
    if (text_log != (ON_TextLog *)0x0) {
      uVar8 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
      ON_TextLog::Print(text_log,"brep trim_index = %d (should be >=0 and <%d=brep.m_T.Count()).\n",
                        (ulong)(uint)trim_index,(ulong)uVar8);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  }
  this_00 = ON_ClassArray<ON_BrepTrim>::operator[]
                      ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,trim_index);
  if (this_00->m_trim_index != trim_index) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"trim.m_trim_index = %d (should be %d).\n",
                        (ulong)(uint)this_00->m_trim_index,(ulong)(uint)trim_index);
      ON_TextLog::PopIndent(text_log);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  }
  uVar8 = (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
            _vptr_ON_Object[6])(this_00,text_log);
  if ((uVar8 & 1) == 0) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  }
  if ((this_00->m_c2i < 0) ||
     (iVar7 = this_00->m_c2i,
     iVar9 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>),
     iVar9 <= iVar7)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      uVar8 = this_00->m_c2i;
      uVar10 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>);
      ON_TextLog::Print(text_log,"trim.m_c2i = %d (should be >=0 and <%d).\n",(ulong)uVar8,0,
                        (ulong)uVar10);
      ON_TextLog::PopIndent(text_log);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  }
  ppOVar12 = ON_SimpleArray<ON_Curve_*>::operator[]
                       (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,this_00->m_c2i);
  pOVar5 = *ppOVar12;
  if (pOVar5 == (ON_Curve *)0x0) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"trim.m_c2i = %d and ON_Brep.m_C2[%d] is nullptr\n",
                        (ulong)(uint)this_00->m_c2i,(ulong)(uint)this_00->m_c2i);
      ON_TextLog::PopIndent(text_log);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  }
  uVar8 = (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
  if (uVar8 != 2) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,
                        "trim.m_c2i = %d and ON_Brep.m_C2[%d]->Dimension() = %d (should be 2).\n",
                        (ulong)(uint)this_00->m_c2i,(ulong)(uint)this_00->m_c2i,(ulong)uVar8);
      ON_TextLog::PopIndent(text_log);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  }
  pOVar13 = ON_CurveProxy::ProxyCurve(&this_00->super_ON_CurveProxy);
  if (pOVar5 != pOVar13) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"trim.ProxyCurve() != m_C2[trim.m_c2i].\n");
      ON_TextLog::PopIndent(text_log);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  }
  (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x25])();
  (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  bVar6 = ON_Interval::IsIncreasing((ON_Interval *)(c2_domain.m_t + 1));
  if (!bVar6) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      pdVar14 = ON_Interval::operator[]((ON_Interval *)(c2_domain.m_t + 1),0);
      dVar2 = *pdVar14;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)(c2_domain.m_t + 1),1);
      ON_TextLog::Print(text_log,"trim.Domain() = (%g,%g) (should be an increasing interval).\n",
                        dVar2,*pdVar14);
      ON_TextLog::PopIndent(text_log);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  }
  bVar6 = ON_Interval::Includes((ON_Interval *)&vi1,(ON_Interval *)(c2_domain.m_t + 1),false);
  if (!bVar6) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      pdVar14 = ON_Interval::operator[]((ON_Interval *)(c2_domain.m_t + 1),0);
      dVar2 = *pdVar14;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)(c2_domain.m_t + 1),1);
      dVar3 = *pdVar14;
      uVar8 = this_00->m_c2i;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)&vi1,0);
      dVar4 = *pdVar14;
      pdVar14 = ON_Interval::operator[]((ON_Interval *)&vi1,1);
      ON_TextLog::Print(text_log,
                        "trim.Domain() = (%g,%g) is not included in brep.m_C2[trim.m_c2i=%d]->Domain() = (%g,%g)\n"
                        ,dVar2,dVar3,dVar4,*pdVar14,(ulong)uVar8);
      ON_TextLog::PopIndent(text_log);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  }
  uVar8 = this_00->m_vi[0];
  uVar10 = this_00->m_vi[1];
  if (((int)uVar8 < 0) ||
     (iVar7 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V),
     iVar7 <= (int)uVar8)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      uVar10 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
      ON_TextLog::Print(text_log,"trim.m_vi[0] = %d (should be >= 0 and < %d=brep.m_V.Count()).\n",
                        (ulong)(uint)trim_index,(ulong)uVar8,(ulong)uVar10);
      ON_TextLog::PopIndent(text_log);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  }
  if (((int)uVar10 < 0) ||
     (iVar7 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V),
     iVar7 <= (int)uVar10)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      uVar8 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
      ON_TextLog::Print(text_log,"trim.m_vi[1] = %d (should be >= 0 and < %d=brep.m_V.Count()).\n",
                        (ulong)(uint)trim_index,(ulong)uVar10,(ulong)uVar8);
      ON_TextLog::PopIndent(text_log);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  }
  uVar11 = this_00->m_ei;
  edge._0_4_ = 0xffffffff;
  if (this_00->m_type == singular) {
    if (uVar11 != 0xffffffff) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"trim.m_type = singular but trim.m_ei = %d (should be -1)\n",
                          (ulong)uVar11);
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    if (uVar8 != uVar10) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,
                          "trim.m_type = singular but trim.m_vi[] = [%d,%d] (the m_vi[] values should be equal).\n"
                          ,(ulong)uVar8,(ulong)uVar10);
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    uVar8 = (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])();
    if ((uVar8 & 1) != 0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,
                          "trim.m_type = singular but brep.m_C2[trim.m_c2i=%d]->IsClosed() is true.\n"
                          ,(ulong)(uint)this_00->m_c2i,(ulong)(uint)this_00->m_c2i);
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
  }
  else if (this_00->m_type != ptonsrf) {
    if (((int)uVar11 < 0) ||
       (iVar7 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E),
       iVar7 <= (int)uVar11)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        uVar8 = this_00->m_ei;
        uVar10 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
        ON_TextLog::Print(text_log,
                          "trim.m_type != singular and trim.m_ei = %d (m_ei should be >=0 and <brep.m_E.Count()=%d\n"
                          ,(ulong)uVar8,(ulong)uVar10);
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    pOVar15 = ON_ClassArray<ON_BrepEdge>::operator[]
                        ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,uVar11);
    if (pOVar15->m_vi[(int)(uint)((this_00->m_bRev3d & 1U) != 0)] != uVar8) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,
                          "trim.m_vi[0] != brep.m_E[trim.m_ei=%d].m_vi[trim.m_bRev3d?1:0]\n",
                          (ulong)uVar11);
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    if (pOVar15->m_vi[(int)(uint)((this_00->m_bRev3d & 1U) == 0)] != uVar10) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,
                          "trim.m_vi[1] != brep.m_E[trim.m_ei=%d].m_vi[trim.m_bRev3d?0:1]\n",
                          (ulong)uVar11);
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    bVar6 = ON_Interval::operator==((ON_Interval *)(c2_domain.m_t + 1),(ON_Interval *)&vi1);
    if (((bVar6) &&
        (uVar11 = (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(),
        (uVar11 & 1) != 0)) && (uVar8 != uVar10)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,
                          "trim.m_vi[] = [%d,%d] but brep.m_C2[trim.m_c2i=%d]->IsClosed()=true\n",
                          (ulong)uVar8,(ulong)uVar10,(ulong)(uint)this_00->m_c2i);
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    for (other_trim._4_4_ = 0; iVar7 = ON_SimpleArray<int>::Count(&pOVar15->m_ti),
        (int)other_trim._4_4_ < iVar7; other_trim._4_4_ = other_trim._4_4_ + 1) {
      piVar16 = ON_SimpleArray<int>::operator[](&pOVar15->m_ti,other_trim._4_4_);
      if (*piVar16 == trim_index) {
        edge._0_4_ = other_trim._4_4_;
        break;
      }
    }
    if ((int)(uint)edge < 0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"trim index %d is not in brep.m_E[trim.m_ei=%d].m_ti[]\n",
                          (ulong)(uint)trim_index,(ulong)(uint)this_00->m_ei);
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    iVar7 = ON_SimpleArray<int>::Count(&pOVar15->m_ti);
    if (iVar7 == 2) {
      piVar16 = ON_SimpleArray<int>::operator[](&pOVar15->m_ti,0);
      piVar16 = ON_SimpleArray<int>::operator[](&pOVar15->m_ti,(uint)(*piVar16 == trim_index));
      iVar7 = *piVar16;
      if (((-1 < iVar7) &&
          (iVar9 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T),
          iVar7 < iVar9)) &&
         ((iVar7 != trim_index &&
          ((pOVar17 = ON_ClassArray<ON_BrepTrim>::operator[]
                                ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,iVar7),
           pOVar17->m_li == this_00->m_li && (this_00->m_type != seam)))))) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
          ON_TextLog::PushIndent(text_log);
          ON_TextLog::Print(text_log,
                            "trim.m_type!=seam but brep.m_E[trim.m_ei=%d] references two trims in loop trim.m_li=%d.\n"
                            ,(ulong)(uint)this_00->m_ei,(ulong)(uint)this_00->m_li);
          ON_TextLog::PopIndent(text_log);
        }
        bVar6 = ON_BrepIsNotValid();
        return bVar6;
      }
    }
  }
  if ((this_00->m_li < 0) ||
     (iVar7 = this_00->m_li,
     iVar9 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L),
     iVar9 <= iVar7)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      uVar8 = this_00->m_li;
      uVar10 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L);
      ON_TextLog::Print(text_log,"trim.m_li = %d (should be >= 0 and <brep.m_L.Count()=%d\n",
                        (ulong)uVar8,(ulong)uVar10);
      ON_TextLog::PopIndent(text_log);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  }
  if ((-1 < this_00->m_ei) && ((int)(uint)edge < 0)) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"brep.m_E[trim.m_ei=%d].m_ti[] does not reference the trim.\n",
                        (ulong)(uint)this_00->m_ei);
      ON_TextLog::PopIndent(text_log);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  }
  switch(this_00->m_type) {
  case unknown:
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,
                        "trim.m_type = unknown (should be set to the correct ON_BrepTrim::TYPE value)\n"
                       );
      ON_TextLog::PopIndent(text_log);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  case boundary:
    pOVar19 = ON_ClassArray<ON_BrepLoop>::operator[]
                        ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,this_00->m_li);
    pOVar15 = ON_ClassArray<ON_BrepEdge>::operator[]
                        ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,this_00->m_ei);
    iVar7 = ON_SimpleArray<int>::Count(&pOVar15->m_ti);
    if (1 < iVar7) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,
                          "trim.m_type = boundary but brep.m_E[trim.m_ei=%d] has 2 or more trims.\n"
                          ,(ulong)(uint)this_00->m_ei);
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    if ((pOVar19->m_type != outer) && (pOVar19->m_type != inner)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,
                          "trim.m_type = boundary but brep.m_L[trim.m_li=%d].m_type is not inner or outer.\n"
                          ,(ulong)(uint)this_00->m_li);
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    break;
  case mated:
    pOVar19 = ON_ClassArray<ON_BrepLoop>::operator[]
                        ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,this_00->m_li);
    pOVar15 = ON_ClassArray<ON_BrepEdge>::operator[]
                        ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,this_00->m_ei);
    iVar7 = ON_SimpleArray<int>::Count(&pOVar15->m_ti);
    if (iVar7 < 2) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,
                          "trim.m_type = mated but brep.m_E[trim.m_ei=%d] only references this trim.\n"
                          ,(ulong)(uint)this_00->m_ei);
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    if ((pOVar19->m_type != outer) && (pOVar19->m_type != inner)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,
                          "trim.m_type = mated but brep.m_L[trim.m_li=%d].m_type is not inner or outer.\n"
                          ,(ulong)(uint)this_00->m_li);
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    break;
  case seam:
    pOVar19 = ON_ClassArray<ON_BrepLoop>::operator[]
                        ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,this_00->m_li);
    pOVar15 = ON_ClassArray<ON_BrepEdge>::operator[]
                        ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,this_00->m_ei);
    iVar7 = ON_SimpleArray<int>::Count(&pOVar15->m_ti);
    if (iVar7 < 2) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"trim.m_type = seam but brep.m_E[trim.m_ei=%d] < 2.\n",
                          (ulong)(uint)this_00->m_ei);
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    i_1 = -1;
    for (local_c0 = 0; iVar7 = ON_SimpleArray<int>::Count(&pOVar15->m_ti), (int)local_c0 < iVar7;
        local_c0 = local_c0 + 1) {
      uVar8 = i_1;
      if ((uint)edge != local_c0) {
        puVar18 = (uint *)ON_SimpleArray<int>::operator[](&pOVar15->m_ti,local_c0);
        uVar10 = *puVar18;
        if (uVar10 == trim_index) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"brep.m_E[%d] trim is not valid.\n",
                              (ulong)(uint)this_00->m_ei);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,"edge.m_ti[%d] = m_ti[%d] = %d.\n",(ulong)(uint)edge,
                              (ulong)local_c0,(ulong)(uint)trim_index);
            ON_TextLog::PopIndent(text_log);
          }
          bVar6 = ON_BrepIsNotValid();
          return bVar6;
        }
        if (((int)uVar10 < 0) ||
           (iVar7 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T),
           iVar7 <= (int)uVar10)) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"brep.m_E[%d] trim is not valid.\n",
                              (ulong)(uint)this_00->m_ei);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,"edge.m_ti[%d]=%d is not a valid m_T[] index.\n",
                              (ulong)local_c0,(ulong)uVar10);
            ON_TextLog::PopIndent(text_log);
          }
          bVar6 = ON_BrepIsNotValid();
          return bVar6;
        }
        pOVar17 = ON_ClassArray<ON_BrepTrim>::operator[]
                            ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,uVar10);
        if (((pOVar17->m_type == seam) && (pOVar17->m_li == this_00->m_li)) &&
           (uVar8 = uVar10, -1 < i_1)) {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"brep.m_T[%d,%d, or %d] trim is not valid.\n",
                              (ulong)(uint)trim_index,(ulong)(uint)i_1,(ulong)uVar10);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,"All three trims have m_type = seam m_ei=%d and m_li = %d.\n"
                              ,(ulong)(uint)this_00->m_ei,(ulong)(uint)this_00->m_li);
            ON_TextLog::PopIndent(text_log);
          }
          bVar6 = ON_BrepIsNotValid();
          return bVar6;
        }
      }
      i_1 = uVar8;
    }
    if (i_1 < 0) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"trim.m_type = seam but its other trim is not in the loop.\n");
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    if ((pOVar19->m_type != outer) &&
       (iVar7 = ON_SimpleArray<int>::Count(&pOVar15->m_ti), iVar7 < 3)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,
                          "trim.m_type = seam, the edge is manifold, but brep.m_L[trim.m_li=%d].m_type is not outer.\n"
                          ,(ulong)(uint)this_00->m_li);
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    break;
  case singular:
    if ((((this_00->m_iso != W_iso) && (this_00->m_iso != N_iso)) && (this_00->m_iso != E_iso)) &&
       (this_00->m_iso != S_iso)) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"trim.m_type = singular but trim.m_iso != N/S/E/W_iso\n");
        ON_TextLog::PopIndent(text_log);
      }
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    break;
  case crvonsrf:
    pOVar19 = ON_ClassArray<ON_BrepLoop>::operator[]
                        ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,this_00->m_li);
    if (pOVar19->m_type != crvonsrf) {
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    if ((this_00->m_c2i < 0) ||
       (iVar7 = this_00->m_c2i,
       iVar9 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>),
       iVar9 <= iVar7)) {
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    if ((this_00->m_ei < 0) ||
       (iVar7 = this_00->m_ei,
       iVar9 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E),
       iVar9 <= iVar7)) {
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    break;
  case ptonsrf:
    pOVar19 = ON_ClassArray<ON_BrepLoop>::operator[]
                        ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,this_00->m_li);
    if (pOVar19->m_type != ptonsrf) {
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    if (this_00->m_ei != -1) {
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    if (this_00->m_c2i != -1) {
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    dVar2 = (this_00->m_pbox).m_min.x;
    pOVar1 = &(this_00->m_pbox).m_max;
    if (((((dVar2 != pOVar1->x) || (NAN(dVar2) || NAN(pOVar1->x))) ||
         (dVar2 = (this_00->m_pbox).m_min.y, pdVar14 = &(this_00->m_pbox).m_max.y, dVar2 != *pdVar14
         )) || ((NAN(dVar2) || NAN(*pdVar14) ||
                (dVar2 = (this_00->m_pbox).m_min.z, pdVar14 = &(this_00->m_pbox).m_max.z,
                dVar2 != *pdVar14)))) || (NAN(dVar2) || NAN(*pdVar14))) {
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    dVar2 = (this_00->m_pbox).m_min.x;
    if ((((dVar2 == -1.23432101234321e+308) && (!NAN(dVar2))) ||
        ((dVar2 = (this_00->m_pbox).m_min.y, dVar2 == -1.23432101234321e+308 && (!NAN(dVar2))))) ||
       ((dVar2 = (this_00->m_pbox).m_min.z, dVar2 != 0.0 || (NAN(dVar2))))) {
      bVar6 = ON_BrepIsNotValid();
      return bVar6;
    }
    break;
  case slit:
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,
                        "trim.m_type = ON_BrepTrim::slit (should be set to the correct ON_BrepTrim::TYPE value)\n"
                       );
      ON_TextLog::PopIndent(text_log);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  case trim_type_count:
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,
                        "trim.m_type = type_count (should be set to the correct ON_BrepTrim::TYPE value)\n"
                       );
      ON_TextLog::PopIndent(text_log);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  default:
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,
                        "trim.m_type = garbage (should be set to the correct ON_BrepTrim::TYPE value)\n"
                       );
      ON_TextLog::PopIndent(text_log);
    }
    bVar6 = ON_BrepIsNotValid();
    return bVar6;
  }
  if (0.0 < this_00->m_tolerance[0] || this_00->m_tolerance[0] == 0.0) {
    if (0.0 < this_00->m_tolerance[1] || this_00->m_tolerance[1] == 0.0) {
      bVar6 = ON_BoundingBox::IsValid(&this_00->m_pbox);
      if (bVar6) {
        if (this_00->m_brep == this) {
          this_local._7_1_ = true;
        }
        else {
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,"trim.m_brep does not point to parent brep.\n");
            ON_TextLog::PopIndent(text_log);
          }
          this_local._7_1_ = ON_BrepIsNotValid();
        }
      }
      else {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
          ON_TextLog::PushIndent(text_log);
          ON_TextLog::Print(text_log,"trim.m_pbox is not valid.\n");
          ON_TextLog::PopIndent(text_log);
        }
        this_local._7_1_ = ON_BrepIsNotValid();
      }
    }
    else {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"trim.m_tolerance[1] = %g (should be >= 0.0)\n",
                          this_00->m_tolerance[1]);
        ON_TextLog::PopIndent(text_log);
      }
      this_local._7_1_ = ON_BrepIsNotValid();
    }
  }
  else {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep.m_T[%d] trim is not valid.\n",(ulong)(uint)trim_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"trim.m_tolerance[0] = %g (should be >= 0.0)\n",
                        this_00->m_tolerance[0]);
      ON_TextLog::PopIndent(text_log);
    }
    this_local._7_1_ = ON_BrepIsNotValid();
  }
  return this_local._7_1_;
}

Assistant:

bool
ON_Brep::IsValidTrim( int trim_index, ON_TextLog* text_log ) const
{
  if ( trim_index < 0 || trim_index >= m_T.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep trim_index = %d (should be >=0 and <%d=brep.m_T.Count()).\n",
                      trim_index, m_T.Count());
    }
    return ON_BrepIsNotValid();
  }
  const ON_BrepTrim& trim = m_T[trim_index];
  if ( trim.m_trim_index != trim_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_trim_index = %d (should be %d).\n",
                       trim.m_trim_index, trim_index );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  if ( !trim.IsValid(text_log) )
  {
    if ( text_log )
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
    return ON_BrepIsNotValid();
  }
  if ( trim.m_c2i < 0 || trim.m_c2i >= m_C2.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print( "trim.m_c2i = %d (should be >=0 and <%d).\n", trim.m_c2i, 0, m_C2.Count() );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  const ON_Curve* pC = m_C2[trim.m_c2i];
  if ( !pC )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_c2i = %d and ON_Brep.m_C2[%d] is nullptr\n", trim.m_c2i, trim.m_c2i );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  int c2_dim = pC->Dimension();
  if ( c2_dim != 2 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_c2i = %d and ON_Brep.m_C2[%d]->Dimension() = %d (should be 2).\n", trim.m_c2i, trim.m_c2i, c2_dim );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( pC != trim.ProxyCurve() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.ProxyCurve() != m_C2[trim.m_c2i].\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  //if ( trim.ProxyCurveIsReversed() )
  //{
  //  if ( text_log )
  //  {
  //    text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
  //    text_log->PushIndent();
  //    text_log->Print("trim.ProxyCurveIsReversed() is true\n");
  //    text_log->PopIndent();
  //  }
  //  return ON_BrepIsNotValid();
  //}

  ON_Interval trim_domain = trim.Domain();
  ON_Interval c2_domain = pC->Domain();
  if ( !trim_domain.IsIncreasing() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.Domain() = (%g,%g) (should be an increasing interval).\n", trim_domain[0], trim_domain[1] );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  if ( !c2_domain.Includes(trim_domain) )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.Domain() = (%g,%g) is not included in brep.m_C2[trim.m_c2i=%d]->Domain() = (%g,%g)\n",
                      trim_domain[0], trim_domain[1], trim.m_c2i, c2_domain[0], c2_domain[1] );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  int vi0 = trim.m_vi[0];
  int vi1 = trim.m_vi[1];
  if ( vi0 < 0 || vi0 >= m_V.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_vi[0] = %d (should be >= 0 and < %d=brep.m_V.Count()).\n",
                       trim_index, vi0, m_V.Count() );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  if ( vi1 < 0 || vi1 >= m_V.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_vi[1] = %d (should be >= 0 and < %d=brep.m_V.Count()).\n",
                       trim_index, vi1, m_V.Count() );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  const int ei = trim.m_ei;
  int trim_eti = -1;
  if ( trim.m_type == ON_BrepTrim::singular ) 
  {
    // singular trim - no edge and 3d v0 = 3d v1
    if ( ei != -1 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = singular but trim.m_ei = %d (should be -1)\n",ei);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( vi0 != vi1 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = singular but trim.m_vi[] = [%d,%d] (the m_vi[] values should be equal).\n",
                        vi0,vi1);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( pC->IsClosed() )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = singular but brep.m_C2[trim.m_c2i=%d]->IsClosed() is true.\n",
                        trim.m_c2i,trim.m_c2i);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
  }
  else if ( trim.m_type != ON_BrepTrim::ptonsrf )
  {
    // non-singular non-ptonsrf trim must have valid edge
    if ( ei < 0 || ei >= m_E.Count() )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type != singular and trim.m_ei = %d (m_ei should be >=0 and <brep.m_E.Count()=%d\n",
                        trim.m_ei,m_E.Count());
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    const ON_BrepEdge& edge = m_E[ei];
    if ( edge.m_vi[trim.m_bRev3d?1:0] != vi0 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_vi[0] != brep.m_E[trim.m_ei=%d].m_vi[trim.m_bRev3d?1:0]\n",ei);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( edge.m_vi[trim.m_bRev3d?0:1] != vi1 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_vi[1] != brep.m_E[trim.m_ei=%d].m_vi[trim.m_bRev3d?0:1]\n",ei);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( trim_domain == c2_domain && pC->IsClosed() ) 
    {
      // (open 2d trims can still have vi0 = vi1 on closed surfaces)
      if ( vi0 != vi1 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_vi[] = [%d,%d] but brep.m_C2[trim.m_c2i=%d]->IsClosed()=true\n",
                          vi0, vi1, trim.m_c2i );
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
    else if ( vi0 == vi1 )
    {
      // TODO: check that trim start/end is a closed surface seam point.
    }
    else
    {
      // vi0 != vi1
      // TODO: check that trim start/end is not a closed surface seam point.
    }
    int i;
    for ( i = 0; i < edge.m_ti.Count(); i++ ) 
    {
      if ( edge.m_ti[i] == trim_index )
      {
        trim_eti = i;
        break;
      }
    }

    if ( trim_eti < 0 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim index %d is not in brep.m_E[trim.m_ei=%d].m_ti[]\n",
                        trim_index, trim.m_ei );
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }

    if ( edge.m_ti.Count() == 2 )
    {
      int other_ti = edge.m_ti[ (edge.m_ti[0]==trim_index)?1:0 ];
      if ( other_ti >= 0 && other_ti < m_T.Count() && other_ti != trim_index )
      {
        const ON_BrepTrim& other_trim = m_T[other_ti];
        if ( other_trim.m_li == trim.m_li )
        {
          if ( trim.m_type != ON_BrepTrim::seam )
          {
            if ( text_log )
            {
              text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
              text_log->PushIndent();
              text_log->Print("trim.m_type!=seam but brep.m_E[trim.m_ei=%d] references two trims in loop trim.m_li=%d.\n",
                              trim.m_ei,trim.m_li);
              text_log->PopIndent();
            }
            return ON_BrepIsNotValid();
          }
        }
      }
    }
  }
  if ( trim.m_li < 0 || trim.m_li >= m_L.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_li = %d (should be >= 0 and <brep.m_L.Count()=%d\n", trim.m_li,m_L.Count() );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( trim.m_ei >= 0 && trim_eti < 0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("brep.m_E[trim.m_ei=%d].m_ti[] does not reference the trim.\n",trim.m_ei);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }


  switch ( trim.m_type )
  {
  case ON_BrepTrim::unknown:
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = unknown (should be set to the correct ON_BrepTrim::TYPE value)\n");
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    break;
  case ON_BrepTrim::boundary:
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      const ON_BrepEdge& edge = m_E[trim.m_ei];
      if ( edge.m_ti.Count() > 1 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = boundary but brep.m_E[trim.m_ei=%d] has 2 or more trims.\n",trim.m_ei);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
      if ( loop.m_type != ON_BrepLoop::outer && loop.m_type != ON_BrepLoop::inner )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = boundary but brep.m_L[trim.m_li=%d].m_type is not inner or outer.\n",trim.m_li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
    break;
  case ON_BrepTrim::mated:
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      const ON_BrepEdge& edge = m_E[trim.m_ei];
      if ( edge.m_ti.Count() < 2 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = mated but brep.m_E[trim.m_ei=%d] only references this trim.\n",trim.m_ei);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
      if ( loop.m_type != ON_BrepLoop::outer && loop.m_type != ON_BrepLoop::inner )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = mated but brep.m_L[trim.m_li=%d].m_type is not inner or outer.\n",trim.m_li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
    break;
  case ON_BrepTrim::seam:
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      const ON_BrepEdge& edge = m_E[trim.m_ei];
      if ( edge.m_ti.Count() < 2 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = seam but brep.m_E[trim.m_ei=%d] < 2.\n",trim.m_ei);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
      int other_ti = -1;
      for ( int eti = 0; eti < edge.m_ti.Count(); eti++ ) 
      {
        if ( trim_eti == eti )
          continue;
        int i = edge.m_ti[eti];
        if ( i == trim_index )
        {
          if ( text_log )
          {
            text_log->Print("brep.m_E[%d] trim is not valid.\n",trim.m_ei);
            text_log->PushIndent();
            text_log->Print("edge.m_ti[%d] = m_ti[%d] = %d.\n",trim_eti,eti,trim_index);
            text_log->PopIndent();
          }
          return ON_BrepIsNotValid();
        }

        if ( i < 0 || i >= m_T.Count() )
        {
          if ( text_log )
          {
            text_log->Print("brep.m_E[%d] trim is not valid.\n",trim.m_ei);
            text_log->PushIndent();
            text_log->Print("edge.m_ti[%d]=%d is not a valid m_T[] index.\n",eti,i);
            text_log->PopIndent();
          }
          return ON_BrepIsNotValid();
        }

        const ON_BrepTrim& other_trim = m_T[i];
        if ( other_trim.m_type == ON_BrepTrim::seam && other_trim.m_li == trim.m_li )
        {
          if ( other_ti < 0 )
            other_ti = i;
          else
          {
            if ( text_log )
            {
              text_log->Print("brep.m_T[%d,%d, or %d] trim is not valid.\n",trim_index,other_ti,i);
              text_log->PushIndent();
              text_log->Print("All three trims have m_type = seam m_ei=%d and m_li = %d.\n",trim.m_ei,trim.m_li);
              text_log->PopIndent();
            }
            return ON_BrepIsNotValid();
          }
        }
      }

      if ( other_ti < 0 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = seam but its other trim is not in the loop.\n");
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }

      if ( loop.m_type != ON_BrepLoop::outer && edge.m_ti.Count() <= 2 )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
          text_log->PushIndent();
          text_log->Print("trim.m_type = seam, the edge is manifold, but brep.m_L[trim.m_li=%d].m_type is not outer.\n",trim.m_li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
      // 31 Jan 2002 - The definition of a seam trim is a trim that is connected to
      //               an edge, is part of loop, and exactly one other trim in the
      //               same loop is connected to the same edge.  This can happen
      //               on the interior of a surface (like an annulus in a plane)
      //               and on non-manifold edges.
      //if ( trim.m_iso != ON_Surface::W_iso && trim.m_iso != ON_Surface::N_iso &&
      //     trim.m_iso != ON_Surface::E_iso && trim.m_iso != ON_Surface::S_iso )
      //{
      //  if ( text_log )
      //  {
      //    text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      //    text_log->PushIndent();
      //    text_log->Print("trim.m_type = seam but trim.m_iso != N/S/E/W_iso\n");
      //    text_log->PopIndent();
      //  }
      //  return ON_BrepIsNotValid();
      //}
    }
    break;
  case ON_BrepTrim::singular:
    // most requirements are checked above
    if ( trim.m_iso != ON_Surface::W_iso && trim.m_iso != ON_Surface::N_iso &&
         trim.m_iso != ON_Surface::E_iso && trim.m_iso != ON_Surface::S_iso )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = singular but trim.m_iso != N/S/E/W_iso\n");
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    break;
  case ON_BrepTrim::crvonsrf:
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      if ( loop.m_type != ON_BrepLoop::crvonsrf )
      {
        return ON_BrepIsNotValid();
      }
      if ( trim.m_c2i < 0 || trim.m_c2i >= m_C2.Count() )
      {
        return ON_BrepIsNotValid();
      }
      if ( trim.m_ei < 0 || trim.m_ei >= m_E.Count() )
      {
        return ON_BrepIsNotValid();
      }
    }
    break;
  case ON_BrepTrim::ptonsrf:
    {
      const ON_BrepLoop& loop = m_L[trim.m_li];
      if ( loop.m_type != ON_BrepLoop::ptonsrf )
      {
        return ON_BrepIsNotValid();
      }
      if ( trim.m_ei != -1 )
      {
        return ON_BrepIsNotValid();
      }
      if ( trim.m_c2i != -1 )
      {
        return ON_BrepIsNotValid();
      }
      if ( trim.m_pbox.m_min.x != trim.m_pbox.m_max.x || trim.m_pbox.m_min.y != trim.m_pbox.m_max.y || trim.m_pbox.m_min.z != trim.m_pbox.m_max.z ) 
      {
        // m_pbox must be a single point that defines surface parameters of the point.
        return ON_BrepIsNotValid();
      }
      if ( trim.m_pbox.m_min.x == ON_UNSET_VALUE || trim.m_pbox.m_min.y == ON_UNSET_VALUE || trim.m_pbox.m_min.z != 0.0 ) 
      {
        // m_pbox must be a single point that defines surface parameters of the point.
        return ON_BrepIsNotValid();
      }
    }
    break;

  case ON_BrepTrim::slit:
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = ON_BrepTrim::slit (should be set to the correct ON_BrepTrim::TYPE value)\n");
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    break;

  case ON_BrepTrim::trim_type_count:
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = type_count (should be set to the correct ON_BrepTrim::TYPE value)\n");
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    break;

  default:
    {
      if ( text_log )
      {
        text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
        text_log->PushIndent();
        text_log->Print("trim.m_type = garbage (should be set to the correct ON_BrepTrim::TYPE value)\n");
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    break;
  }

  if ( trim.m_tolerance[0] < 0.0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_tolerance[0] = %g (should be >= 0.0)\n",trim.m_tolerance[0]);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  if ( trim.m_tolerance[1] < 0.0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_tolerance[1] = %g (should be >= 0.0)\n",trim.m_tolerance[1]);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( !trim.m_pbox.IsValid() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_pbox is not valid.\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( trim.m_brep != this )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_T[%d] trim is not valid.\n",trim_index);
      text_log->PushIndent();
      text_log->Print("trim.m_brep does not point to parent brep.\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  return true;
}